

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O3

err_t MATROSKA_LinkBlockWithWriteTracks(matroska_block *Block,ebml_master *Tracks,int ForProfile)

{
  ebml_master *peVar1;
  ebml_master *peVar2;
  ebml_context *peVar3;
  bool_t bVar4;
  ebml_integer *Element;
  ulong uVar5;
  err_t eVar6;
  ebml_master *Element_00;
  bool bVar7;
  ebml_master *local_28;
  
  peVar1 = Block->WriteTrack;
  peVar3 = MATROSKA_getContextTracks();
  bVar4 = EBML_ElementIsType(&Tracks->Base,peVar3);
  if (bVar4 == 0) {
    __assert_fail("EBML_ElementIsType((ebml_element*)Tracks, MATROSKA_getContextTracks())",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x153,
                  "err_t MATROSKA_LinkBlockWithWriteTracks(matroska_block *, ebml_master *, int)");
  }
  bVar4 = Node_IsPartOf(Block,0x4c424b4d);
  if (bVar4 != 0) {
    Element_00 = (ebml_master *)(Tracks->Base).Base.Children;
    while( true ) {
      if (Element_00 == (ebml_master *)0x0) {
        return -3;
      }
      peVar3 = MATROSKA_getContextTrackNumber();
      Element = (ebml_integer *)EBML_MasterFindFirstElt(Element_00,peVar3,0,0,0);
      if (((Element != (ebml_integer *)0x0) && ((Element->Base).bValueIsSet != '\0')) &&
         (uVar5 = EBML_IntegerValue(Element), uVar5 == Block->TrackNumber)) break;
      peVar2 = (ebml_master *)(Element_00->Base).Base.Next;
      bVar7 = Element_00 == peVar2;
      Element_00 = peVar2;
      if (bVar7) {
        __assert_fail("(nodetree*)(Track) != ((nodetree*)(Track))->Next",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                      ,0x155,
                      "err_t MATROSKA_LinkBlockWithWriteTracks(matroska_block *, ebml_master *, int)"
                     );
      }
    }
    local_28 = Element_00;
    (**(code **)((long)(Block->Base).Base.Base.Base.VMT + 0x20))(Block,0x182,&local_28,8);
    if (peVar1 != (ebml_master *)0x0) {
      return 0;
    }
    eVar6 = CheckCompression(Block,ForProfile);
    return eVar6;
  }
  __assert_fail("Node_IsPartOf(Block,MATROSKA_BLOCK_CLASS)",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                ,0x154,
                "err_t MATROSKA_LinkBlockWithWriteTracks(matroska_block *, ebml_master *, int)");
}

Assistant:

err_t MATROSKA_LinkBlockWithWriteTracks(matroska_block *Block, ebml_master *Tracks, int ForProfile)
{
    ebml_master *Track;
    ebml_integer *TrackNum;
    bool_t WasLinked = Block->WriteTrack!=NULL;

    assert(EBML_ElementIsType((ebml_element*)Tracks, MATROSKA_getContextTracks()));
    assert(Node_IsPartOf(Block,MATROSKA_BLOCK_CLASS));
    for (Track=(ebml_master*)EBML_MasterChildren(Tracks);Track;Track=(ebml_master*)EBML_MasterNext(Track))
    {
        TrackNum = (ebml_integer*)EBML_MasterFindChild(Track,MATROSKA_getContextTrackNumber());
        if (TrackNum && ((ebml_element*)TrackNum)->bValueIsSet && EBML_IntegerValue(TrackNum)==Block->TrackNumber)
        {
            Node_SET(Block,MATROSKA_BLOCK_WRITE_TRACK,&Track);
            if (WasLinked)
                return ERR_NONE;
            return CheckCompression(Block, ForProfile);
        }
    }
    return ERR_INVALID_DATA;
}